

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.hpp
# Opt level: O0

SH<15> * operator+(SH<15> *__return_storage_ptr__,SH<15> *a,SH<15> *b)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  undefined4 local_20;
  undefined4 local_1c;
  int m;
  int l;
  SH<15> *b_local;
  SH<15> *a_local;
  
  SH<15>::SH(__return_storage_ptr__);
  for (local_1c = 0; local_1c < 0xf; local_1c = local_1c + 1) {
    for (local_20 = -local_1c; local_20 <= local_1c; local_20 = local_20 + 1) {
      pfVar3 = SH<15>::at(a,local_1c,local_20);
      fVar1 = *pfVar3;
      pfVar3 = SH<15>::at(b,local_1c,local_20);
      fVar2 = *pfVar3;
      pfVar3 = SH<15>::at(__return_storage_ptr__,local_1c,local_20);
      *pfVar3 = fVar1 + fVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SH<n> operator+(const SH<n>& a, const SH<n>& b)
{
    SH<n> c;
    for (int l=0; l<n; ++l)
        for (int m=-l; m<=l; ++m)
            c.at(l,m) = a.at(l,m) + b.at(l,m);
    return c;
}